

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O0

void __thiscall xercesc_4_0::CMStateSet::operator|=(CMStateSet *this,CMStateSet *setToOr)

{
  XMLInt32 *pXVar1;
  ulong uVar2;
  ulong uVar3;
  XMLInt32 **ppXVar4;
  XMLInt32 **ppXVar5;
  ulong *puVar6;
  ulong *puVar7;
  ulong local_150;
  XMLSize_t subIndex_1;
  __m128i xmm3_1;
  __m128i xmm2_1;
  __m128i xmm1_1;
  ulong local_110;
  XMLSize_t subIndex;
  XMLInt32 **mine;
  XMLInt32 **other;
  XMLSize_t index_1;
  XMLSize_t index;
  __m128i xmm3;
  __m128i xmm2;
  __m128i xmm1;
  CMStateSet *setToOr_local;
  CMStateSet *this_local;
  
  if (this->fDynamicBuffer == (CMDynamicBuffer *)0x0) {
    if ((XMLPlatformUtils::fgSSE2ok & 1) == 0) {
      for (index_1 = 0; index_1 < 4; index_1 = index_1 + 1) {
        if (setToOr->fBits[index_1] != 0) {
          if (this->fBits[index_1] == 0) {
            this->fBits[index_1] = setToOr->fBits[index_1];
          }
          else {
            this->fBits[index_1] = setToOr->fBits[index_1] | this->fBits[index_1];
          }
        }
      }
    }
    else {
      uVar2 = *(ulong *)(setToOr->fBits + 2);
      *(ulong *)this->fBits = *(ulong *)this->fBits | *(ulong *)setToOr->fBits;
      *(ulong *)(this->fBits + 2) = *(ulong *)(this->fBits + 2) | uVar2;
    }
  }
  else {
    for (other = (XMLInt32 **)0x0; other < (XMLInt32 **)this->fDynamicBuffer->fArraySize;
        other = (XMLInt32 **)((long)other + 1)) {
      ppXVar4 = setToOr->fDynamicBuffer->fBitArray + (long)other;
      if (*ppXVar4 != (XMLInt32 *)0x0) {
        if (this->fDynamicBuffer->fBitArray[(long)other] == (XMLInt32 *)0x0) {
          allocateChunk(this,(XMLSize_t)other);
          memcpy(this->fDynamicBuffer->fBitArray[(long)other],*ppXVar4,0x80);
        }
        else {
          ppXVar5 = this->fDynamicBuffer->fBitArray + (long)other;
          if ((XMLPlatformUtils::fgSSE2ok & 1) == 0) {
            for (local_150 = 0; local_150 < 0x20; local_150 = local_150 + 1) {
              if (setToOr->fDynamicBuffer->fBitArray[(long)other][local_150] != 0) {
                if (this->fDynamicBuffer->fBitArray[(long)other][local_150] == 0) {
                  this->fDynamicBuffer->fBitArray[(long)other][local_150] =
                       setToOr->fDynamicBuffer->fBitArray[(long)other][local_150];
                }
                else {
                  pXVar1 = this->fDynamicBuffer->fBitArray[(long)other];
                  pXVar1[local_150] =
                       setToOr->fDynamicBuffer->fBitArray[(long)other][local_150] |
                       pXVar1[local_150];
                }
              }
            }
          }
          else {
            for (local_110 = 0; local_110 < 0x20; local_110 = local_110 + 4) {
              uVar2 = *(ulong *)((long)(*ppXVar4 + local_110) + 8);
              puVar6 = (ulong *)(*ppXVar5 + local_110);
              uVar3 = puVar6[1];
              puVar7 = (ulong *)(*ppXVar5 + local_110);
              *puVar7 = *(ulong *)(*ppXVar4 + local_110) | *puVar6;
              puVar7[1] = uVar2 | uVar3;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void operator|=(const CMStateSet& setToOr)
    {
        if(fDynamicBuffer==0)
        {
#ifdef XERCES_HAVE_SSE2_INTRINSIC
            if(XMLPlatformUtils::fgSSE2ok)
            {
                __m128i xmm1 = _mm_loadu_si128(reinterpret_cast<const __m128i*>(fBits));
                __m128i xmm2 = _mm_loadu_si128(reinterpret_cast<const __m128i*>(setToOr.fBits));
                __m128i xmm3 = _mm_or_si128(xmm1, xmm2);     //  OR  4 32-bit words
                _mm_storeu_si128(reinterpret_cast<__m128i*>(fBits), xmm3);
            }
            else
#endif
            {
                for (XMLSize_t index = 0; index < CMSTATE_CACHED_INT32_SIZE; index++)
                    if(setToOr.fBits[index])
                    {
                        if(fBits[index])
                            fBits[index] |= setToOr.fBits[index];
                        else
                            fBits[index] = setToOr.fBits[index];
                    }
            }
        }
        else
        {
            for (XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
            {
                XMLInt32 *& other = setToOr.fDynamicBuffer->fBitArray[index];
                if(other!=NULL)
                {
                    // if we haven't allocated the subvector yet, allocate it and copy
                    if(fDynamicBuffer->fBitArray[index]==NULL)
                    {
                        allocateChunk(index);
                        memcpy((void *) fDynamicBuffer->fBitArray[index],
                               (const void *) other,
                               CMSTATE_BITFIELD_INT32_SIZE * sizeof(XMLInt32));
                    }
                    else
                    {
                        // otherwise, merge them
                        XMLInt32*& mine = fDynamicBuffer->fBitArray[index];
#ifdef XERCES_HAVE_SSE2_INTRINSIC
                        if(XMLPlatformUtils::fgSSE2ok)
                        {
                            for(XMLSize_t subIndex = 0; subIndex < CMSTATE_BITFIELD_INT32_SIZE; subIndex+=4)
                            {
                               __m128i xmm1 = _mm_load_si128(reinterpret_cast<const __m128i*>(&other[subIndex]));
                               __m128i xmm2 = _mm_load_si128(reinterpret_cast<const __m128i*>(&mine[subIndex]));
                               __m128i xmm3 = _mm_or_si128(xmm1, xmm2);     //  OR  4 32-bit words
                               _mm_store_si128(reinterpret_cast<__m128i*>(&mine[subIndex]), xmm3);
                            }
                        }
                        else
#endif
                        {
                            for(XMLSize_t subIndex = 0; subIndex < CMSTATE_BITFIELD_INT32_SIZE; subIndex++)
                                if(setToOr.fDynamicBuffer->fBitArray[index][subIndex])
                                {
                                    if(fDynamicBuffer->fBitArray[index][subIndex])
                                        fDynamicBuffer->fBitArray[index][subIndex] |= setToOr.fDynamicBuffer->fBitArray[index][subIndex];
                                    else
                                        fDynamicBuffer->fBitArray[index][subIndex] = setToOr.fDynamicBuffer->fBitArray[index][subIndex];
                                }
                        }
                    }
                }
            }
        }
    }